

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesquickselects.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
SesquickselectK2<long_double>::samplingParameter
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          SesquickselectK2<long_double> *this,longdouble alpha)

{
  size_type sVar1;
  initializer_list<unsigned_int> __l;
  allocator_type local_15;
  uint local_14 [3];
  
  if (this->nuStar <= alpha) {
    if (alpha <= (longdouble)1 - this->nuStar) {
      local_14[0] = 0;
      local_14[1] = 0;
      local_14[2] = 0;
      sVar1 = 3;
      goto LAB_00104e87;
    }
    local_14[0] = 1;
    local_14[1] = 0;
  }
  else {
    local_14[0] = 0;
    local_14[1] = 1;
  }
  sVar1 = 2;
LAB_00104e87:
  __l._M_array = local_14;
  __l._M_len = sVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__l,&local_15);
  return __return_storage_ptr__;
}

Assistant:

vector<unsigned int> samplingParameter(const Num alpha) const override {
		if (alpha < nuStar) return {0, 1};
		if (alpha > 1 - nuStar) return {1, 0};
		// else
		return {0, 0, 0};
	}